

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

char __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::GetCharacter(CordRepBtree *this,size_t offset)

{
  const_reference pvVar1;
  CordRep *this_00;
  string_view local_48;
  undefined1 local_38 [8];
  Position front;
  CordRepBtree *pCStack_20;
  int height;
  CordRepBtree *node;
  size_t offset_local;
  CordRepBtree *this_local;
  
  if (offset < (this->super_CordRep).length) {
    front.n._4_4_ = CordRepBtree::height(this);
    pCStack_20 = this;
    node = (CordRepBtree *)offset;
    while( true ) {
      _local_38 = IndexOf(pCStack_20,(size_t)node);
      front.n._4_4_ = front.n._4_4_ + -1;
      if (front.n._4_4_ < 0) break;
      node = (CordRepBtree *)front.index;
      this_00 = Edge(pCStack_20,(size_t)local_38);
      pCStack_20 = CordRep::btree(this_00);
    }
    local_48 = Data(pCStack_20,(size_t)local_38);
    pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (&local_48,front.index);
    return *pvVar1;
  }
  __assert_fail("offset < length",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x3ea,"char absl::cord_internal::CordRepBtree::GetCharacter(size_t) const");
}

Assistant:

char CordRepBtree::GetCharacter(size_t offset) const {
  assert(offset < length);
  const CordRepBtree* node = this;
  int height = node->height();
  for (;;) {
    Position front = node->IndexOf(offset);
    if (--height < 0) return node->Data(front.index)[front.n];
    offset = front.n;
    node = node->Edge(front.index)->btree();
  }
}